

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

vector<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_> * __thiscall
wasm::Random::items<wasm::BinaryOp>
          (vector<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_> *__return_storage_ptr__,
          Random *this,FeatureOptions<wasm::BinaryOp> *picker)

{
  _Base_ptr p_Var1;
  
  (__return_storage_ptr__->super__Vector_base<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (p_Var1 = (picker->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(picker->options)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if ((p_Var1[1]._M_color & ~(this->features).features) == _S_red) {
      std::vector<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_>::reserve
                (__return_storage_ptr__,
                 ((long)p_Var1[1]._M_left - (long)p_Var1[1]._M_parent >> 2) +
                 ((long)(__return_storage_ptr__->
                        super__Vector_base<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_>)._M_impl
                        .super__Vector_impl_data._M_finish -
                  (long)(__return_storage_ptr__->
                        super__Vector_base<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_>)._M_impl
                        .super__Vector_impl_data._M_start >> 2));
      std::vector<wasm::BinaryOp,std::allocator<wasm::BinaryOp>>::
      insert<__gnu_cxx::__normal_iterator<wasm::BinaryOp_const*,std::vector<wasm::BinaryOp,std::allocator<wasm::BinaryOp>>>,void>
                ((vector<wasm::BinaryOp,std::allocator<wasm::BinaryOp>> *)__return_storage_ptr__,
                 (const_iterator)
                 (__return_storage_ptr__->
                 super__Vector_base<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_>)._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<const_wasm::BinaryOp_*,_std::vector<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_>_>
                  )p_Var1[1]._M_parent,
                 (__normal_iterator<const_wasm::BinaryOp_*,_std::vector<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_>_>
                  )p_Var1[1]._M_left);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> items(FeatureOptions<T>& picker) {
    std::vector<T> matches;
    for (const auto& item : picker.options) {
      if (features.has(item.first)) {
        matches.reserve(matches.size() + item.second.size());
        matches.insert(matches.end(), item.second.begin(), item.second.end());
      }
    }
    return matches;
  }